

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyimpl.cpp
# Opt level: O2

void __thiscall QNetworkReplyImplPrivate::_q_startOperation(QNetworkReplyImplPrivate *this)

{
  char cVar1;
  bool bVar2;
  QDebug *pQVar3;
  QArrayDataPointer<char16_t> *this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_90;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_60;
  char *local_48;
  QUrl local_40;
  undefined1 local_38 [8];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->state & ~Buffering) == Working) {
    local_60.d._0_4_ = 2;
    local_60.size._4_4_ = 0;
    local_60._4_8_ = 0;
    local_60._12_8_ = 0;
    local_48 = "default";
    QMessageLogger::debug();
    pQVar3 = QDebug::operator<<((QDebug *)&local_78,
                                "QNetworkReplyImpl::_q_startOperation was called more than once");
    local_40.d = (QUrlPrivate *)pQVar3->stream;
    *(int *)((Stream *)local_40.d + 0x28) = *(int *)((Stream *)local_40.d + 0x28) + 1;
    ::operator<<((Stream *)local_38,&local_40);
    QDebug::~QDebug((QDebug *)local_38);
    QDebug::~QDebug((QDebug *)&local_40);
    QDebug::~QDebug((QDebug *)&local_78);
  }
  else {
    this->state = Working;
    if (this->backend == (QNetworkAccessBackend *)0x0) {
      this_00 = &local_78;
      QCoreApplication::translate((char *)this_00,"QNetworkReply","Protocol \"%1\" is unknown",0);
      QUrl::scheme();
      QString::arg<QString,_true>
                ((QString *)&local_60,(QString *)this_00,(QString *)&local_90,0,(QChar)0x20);
      error(this,ProtocolUnknownError,(QString *)&local_60);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
    }
    else {
      cVar1 = (**(code **)(*(long *)this->backend + 0x60))();
      if (cVar1 != '\0') {
        QElapsedTimer::start();
        QElapsedTimer::invalidate();
        if ((QNetworkAccessBackend *)this->backend != (QNetworkAccessBackend *)0x0) {
          bVar2 = QNetworkAccessBackend::isSynchronous((QNetworkAccessBackend *)this->backend);
          if (bVar2) {
            this->state = Finished;
            if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
              QNetworkReply::setFinished
                        (*(QNetworkReply **)&(this->super_QNetworkReplyPrivate).field_0x8,true);
              return;
            }
            goto LAB_0018f5c5;
          }
        }
        if (this->state != Finished) {
          if ((this->super_QNetworkReplyPrivate).operation == GetOperation) {
            local_60.d._0_4_ = 0;
            std::
            vector<QNetworkReplyImplPrivate::InternalNotifications,_std::allocator<QNetworkReplyImplPrivate::InternalNotifications>_>
            ::emplace_back<QNetworkReplyImplPrivate::InternalNotifications>
                      (&this->pendingNotifications,(InternalNotifications *)&local_60);
          }
          handleNotifications(this);
        }
        goto LAB_0018f540;
      }
      local_60.d._0_4_ = 2;
      local_60.size._4_4_ = 0;
      local_60._4_8_ = 0;
      local_60._12_8_ = 0;
      local_48 = "default";
      QMessageLogger::warning((char *)&local_60,"Backend start failed");
      this->state = Working;
      this_00 = &local_60;
      QCoreApplication::translate((char *)this_00,"QNetworkReply","backend start error.",0);
      error(this,UnknownNetworkError,(QString *)this_00);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(this_00);
    finished(this);
  }
LAB_0018f540:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
LAB_0018f5c5:
  __stack_chk_fail();
}

Assistant:

void QNetworkReplyImplPrivate::_q_startOperation()
{
    // ensure this function is only being called once
    if (state == Working || state == Finished) {
        qDebug() << "QNetworkReplyImpl::_q_startOperation was called more than once" << url;
        return;
    }
    state = Working;

    // note: if that method is called directly, it cannot happen that the backend is 0,
    // because we just checked via a qobject_cast that we got a http backend (see
    // QNetworkReplyImplPrivate::setup())
    if (!backend) {
        error(QNetworkReplyImpl::ProtocolUnknownError,
              QCoreApplication::translate("QNetworkReply", "Protocol \"%1\" is unknown").arg(url.scheme())); // not really true!;
        finished();
        return;
    }

    if (!backend->start()) {
        qWarning("Backend start failed");
        state = Working;
        error(QNetworkReplyImpl::UnknownNetworkError,
              QCoreApplication::translate("QNetworkReply", "backend start error."));
        finished();
        return;
    }

    // Prepare timer for progress notifications
    downloadProgressSignalChoke.start();
    uploadProgressSignalChoke.invalidate();

    if (backend && backend->isSynchronous()) {
        state = Finished;
        q_func()->setFinished(true);
    } else {
        if (state != Finished) {
            if (operation == QNetworkAccessManager::GetOperation)
                pendingNotifications.push_back(NotifyDownstreamReadyWrite);

            handleNotifications();
        }
    }
}